

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O3

void eckey_debug(mbedtls_pk_context *pk,mbedtls_pk_debug_item *items)

{
  void *pvVar1;
  
  pvVar1 = pk->pk_ctx;
  items->type = MBEDTLS_PK_DEBUG_ECP;
  items->name = "eckey.Q";
  items->value = (void *)((long)pvVar1 + 0xd0);
  return;
}

Assistant:

static void eckey_debug(mbedtls_pk_context *pk, mbedtls_pk_debug_item *items)
{
#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    items->type = MBEDTLS_PK_DEBUG_PSA_EC;
    items->name = "eckey.Q";
    items->value = pk;
#else /* MBEDTLS_PK_USE_PSA_EC_DATA */
    mbedtls_ecp_keypair *ecp = (mbedtls_ecp_keypair *) pk->pk_ctx;
    items->type = MBEDTLS_PK_DEBUG_ECP;
    items->name = "eckey.Q";
    items->value = &(ecp->Q);
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */
}